

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall
Catch::ConsoleReporter::sectionEnded(ConsoleReporter *this,SectionStats *_sectionStats)

{
  bool bVar1;
  TablePrinter *this_00;
  ColourGuard *rhs;
  size_type sVar2;
  ostream *poVar3;
  string *in_RSI;
  long in_RDI;
  double dur;
  ColourGuard guard;
  double in_stack_000000c8;
  SectionStats *in_stack_ffffffffffffff38;
  ConsoleReporter *in_stack_ffffffffffffff40;
  ColourImpl *in_stack_ffffffffffffff48;
  string local_68 [32];
  undefined8 local_48;
  ColourGuard local_20;
  string *local_10;
  
  local_10 = in_RSI;
  this_00 = Detail::unique_ptr<Catch::TablePrinter>::operator->
                      ((unique_ptr<Catch::TablePrinter> *)(in_RDI + 0x90));
  TablePrinter::close(this_00,(int)in_RSI);
  if (((byte)local_10[0x58] & 1) != 0) {
    lazyPrint(in_stack_ffffffffffffff40);
    Detail::unique_ptr<Catch::ColourImpl>::operator->
              ((unique_ptr<Catch::ColourImpl> *)(in_RDI + 0x28));
    ColourImpl::guardColour
              (in_stack_ffffffffffffff48,(Code)((ulong)in_stack_ffffffffffffff40 >> 0x20));
    rhs = ColourImpl::ColourGuard::engage
                    ((ColourGuard *)in_stack_ffffffffffffff40,(ostream *)in_stack_ffffffffffffff38);
    ColourImpl::ColourGuard::ColourGuard(&local_20,rhs);
    ColourImpl::ColourGuard::~ColourGuard((ColourGuard *)in_stack_ffffffffffffff40);
    sVar2 = std::vector<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>::size
                      ((vector<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_> *)
                       (in_RDI + 0x78));
    if (sVar2 < 2) {
      std::operator<<(*(ostream **)(in_RDI + 0x20),"\nNo assertions in test case");
    }
    else {
      std::operator<<(*(ostream **)(in_RDI + 0x20),"\nNo assertions in section");
    }
    poVar3 = std::operator<<(*(ostream **)(in_RDI + 0x20)," \'");
    poVar3 = std::operator<<(poVar3,local_10);
    poVar3 = std::operator<<(poVar3,"\'\n\n");
    std::ostream::operator<<(poVar3,std::flush<char,std::char_traits<char>>);
    ColourImpl::ColourGuard::~ColourGuard((ColourGuard *)in_stack_ffffffffffffff40);
  }
  local_48 = *(undefined8 *)(local_10 + 0x50);
  bVar1 = shouldShowDuration((IConfig *)in_stack_ffffffffffffff48,(double)in_stack_ffffffffffffff40)
  ;
  if (bVar1) {
    poVar3 = *(ostream **)(in_RDI + 0x20);
    getFormattedDuration_abi_cxx11_(in_stack_000000c8);
    poVar3 = std::operator<<(poVar3,local_68);
    poVar3 = std::operator<<(poVar3," s: ");
    in_stack_ffffffffffffff40 = (ConsoleReporter *)std::operator<<(poVar3,local_10);
    in_stack_ffffffffffffff38 =
         (SectionStats *)std::operator<<((ostream *)in_stack_ffffffffffffff40,'\n');
    std::ostream::operator<<(in_stack_ffffffffffffff38,std::flush<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_68);
  }
  if ((*(byte *)(in_RDI + 0x98) & 1) != 0) {
    *(undefined1 *)(in_RDI + 0x98) = 0;
  }
  StreamingReporterBase::sectionEnded
            (&in_stack_ffffffffffffff40->super_StreamingReporterBase,in_stack_ffffffffffffff38);
  return;
}

Assistant:

void ConsoleReporter::sectionEnded(SectionStats const& _sectionStats) {
    m_tablePrinter->close();
    if (_sectionStats.missingAssertions) {
        lazyPrint();
        auto guard =
            m_colour->guardColour( Colour::ResultError ).engage( m_stream );
        if (m_sectionStack.size() > 1)
            m_stream << "\nNo assertions in section";
        else
            m_stream << "\nNo assertions in test case";
        m_stream << " '" << _sectionStats.sectionInfo.name << "'\n\n" << std::flush;
    }
    double dur = _sectionStats.durationInSeconds;
    if (shouldShowDuration(*m_config, dur)) {
        m_stream << getFormattedDuration(dur) << " s: " << _sectionStats.sectionInfo.name << '\n' << std::flush;
    }
    if (m_headerPrinted) {
        m_headerPrinted = false;
    }
    StreamingReporterBase::sectionEnded(_sectionStats);
}